

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  lua_State *L_00;
  char cVar3;
  int iVar4;
  int iVar5;
  char *s;
  char *p;
  char *e;
  char *pcVar6;
  ushort **ppuVar7;
  ulong n;
  ulong uVar8;
  size_t lp;
  size_t l;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  size_t local_22b8;
  ulong local_22b0;
  lua_State *local_22a8;
  char *local_22a0;
  size_t local_2298;
  ulong local_2290;
  size_t local_2288;
  MatchState local_2280;
  luaL_Buffer local_2050;
  ulong uVar9;
  
  s = luaL_checklstring(L,1,&local_2288);
  p = luaL_checklstring(L,2,&local_22b8);
  iVar4 = lua_type(L,3);
  local_2290 = luaL_optinteger(L,4,local_2288 + 1);
  cVar1 = *p;
  if (3 < iVar4 - 3U) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&local_2050);
  if (cVar1 == '^') {
    p = p + 1;
    local_22b8 = local_22b8 - 1;
  }
  local_2280.matchdepth = 200;
  local_2280.src_end = s + local_2288;
  local_2280.p_end = p + local_22b8;
  n = 0;
  local_22a8 = L;
  local_22a0 = p;
  local_2280.src_init = s;
  local_2280.L = L;
  do {
    e = s;
    if (local_2290 <= n) break;
    local_2280.level = 0;
    e = match(&local_2280,s,p);
    L_00 = local_2280.L;
    if (e == (char *)0x0) {
LAB_0011a14f:
      e = s;
      if (local_2280.src_end <= s) break;
      if (local_2050.size <= local_2050.n) {
        luaL_prepbuffsize(&local_2050,1);
      }
      e = s + 1;
      local_2050.b[local_2050.n] = *s;
      local_2050.n = local_2050.n + 1;
    }
    else {
      if (iVar4 == 5) {
        push_onecapture(&local_2280,0,s,e);
        lua_gettable(L_00,3);
LAB_00119f61:
        iVar5 = lua_toboolean(L_00,-1);
        if (iVar5 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        else {
          iVar5 = lua_isstring(L_00,-1);
          if (iVar5 == 0) {
            iVar5 = lua_type(L_00,-1);
            pcVar6 = lua_typename(L_00,iVar5);
            luaL_error(L_00,"invalid replacement value (a %s)",pcVar6);
          }
        }
        luaL_addvalue(&local_2050);
      }
      else {
        if (iVar4 == 6) {
          lua_pushvalue(local_2280.L,3);
          iVar5 = push_captures(&local_2280,s,e);
          lua_callk(L_00,iVar5,1,0,(lua_CFunction)0x0);
          goto LAB_00119f61;
        }
        pcVar6 = lua_tolstring(local_2280.L,3,&local_22b0);
        p = local_22a0;
        if (local_22b0 != 0) {
          local_2298 = (long)e - (long)s;
          uVar8 = 0;
          do {
            cVar3 = pcVar6[uVar8];
            if (cVar3 == '%') {
              uVar9 = uVar8 + 1;
              ppuVar7 = __ctype_b_loc();
              bVar2 = pcVar6[uVar8 + 1];
              if ((*(byte *)((long)*ppuVar7 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                if (bVar2 != 0x25) {
                  luaL_error(local_2280.L,"invalid use of \'%c\' in replacement string",0x25);
                }
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                }
                local_2050.b[local_2050.n] = pcVar6[uVar9];
                local_2050.n = local_2050.n + 1;
              }
              else if (bVar2 == 0x30) {
                luaL_addlstring(&local_2050,s,local_2298);
              }
              else {
                push_onecapture(&local_2280,(char)bVar2 + -0x31,s,e);
                luaL_addvalue(&local_2050);
              }
            }
            else {
              if (local_2050.size <= local_2050.n) {
                luaL_prepbuffsize(&local_2050,1);
                cVar3 = pcVar6[uVar8];
              }
              local_2050.b[local_2050.n] = cVar3;
              uVar9 = uVar8;
              local_2050.n = local_2050.n + 1;
            }
            uVar8 = uVar9 + 1;
            p = local_22a0;
          } while (uVar8 < local_22b0);
        }
      }
      n = n + 1;
      if (e <= s) goto LAB_0011a14f;
    }
    s = e;
  } while (cVar1 != '^');
  luaL_addlstring(&local_2050,e,(long)local_2280.src_end - (long)e);
  luaL_pushresult(&local_2050);
  lua_pushinteger(local_22a8,n);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checklstring(L, 2, &lp);
  int tr = lua_type(L, 3);
  size_t max_s = luaL_optinteger(L, 4, srcl+1);
  int anchor = (*p == '^');
  size_t n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  ms.L = L;
  ms.matchdepth = MAXCCALLS;
  ms.src_init = src;
  ms.src_end = src+srcl;
  ms.p_end = p + lp;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    lua_assert(ms.matchdepth == MAXCCALLS);
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e, tr);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}